

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

obj * shop_object(xchar x,xchar y)

{
  level *lev;
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  monst *mtmp;
  monst *local_38;
  monst *shkp;
  obj *otmp;
  xchar y_local;
  monst *pmStack_10;
  xchar x_local;
  
  lev = level;
  pcVar3 = in_rooms(level,x,y,0x12);
  mtmp = shop_keeper(lev,*pcVar3);
  if ((mtmp == (monst *)0x0) || (iVar2 = inhishop(mtmp), iVar2 == 0)) {
    pmStack_10 = (monst *)0x0;
  }
  else {
    for (shkp = (monst *)level->objects[x][y];
        (shkp != (monst *)0x0 && (*(char *)((long)&shkp->mspec_used + 1) == '\f'));
        shkp = (monst *)shkp->data) {
    }
    if ((((shkp == (monst *)0x0) || (bVar1 = costly_spot(x,y), bVar1 == '\0')) ||
        ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0)) ||
       (((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) == 0 ||
        ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) != 0)))) {
      local_38 = (monst *)0x0;
    }
    else {
      local_38 = shkp;
    }
    pmStack_10 = local_38;
  }
  return (obj *)pmStack_10;
}

Assistant:

struct obj *shop_object(xchar x, xchar y)
{
    struct obj *otmp;
    struct monst *shkp;

    if (!(shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE))) || !inhishop(shkp))
	return NULL;

    for (otmp = level->objects[x][y]; otmp; otmp = otmp->nexthere)
	if (otmp->oclass != COIN_CLASS)
	    break;
    /* note: otmp might have ->no_charge set, but that's ok */
    return (otmp && costly_spot(x, y) && NOTANGRY(shkp)
	    && shkp->mcanmove && !shkp->msleeping)
		? otmp : NULL;
}